

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O2

uint8_t * __thiscall
icu_63::RuleBasedBreakIterator::getBinaryRules(RuleBasedBreakIterator *this,uint32_t *length)

{
  RBBIDataHeader *pRVar1;
  
  *length = 0;
  if (this->fData != (RBBIDataWrapper *)0x0) {
    pRVar1 = this->fData->fHeader;
    *length = pRVar1->fLength;
    return (uint8_t *)pRVar1;
  }
  return (uint8_t *)0x0;
}

Assistant:

const uint8_t  *RuleBasedBreakIterator::getBinaryRules(uint32_t &length) {
    const uint8_t  *retPtr = NULL;
    length = 0;

    if (fData != NULL) {
        retPtr = (const uint8_t *)fData->fHeader;
        length = fData->fHeader->fLength;
    }
    return retPtr;
}